

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

section * __thiscall ELFIO::elfio::create_section(elfio *this)

{
  elf_header *peVar1;
  pointer puVar2;
  uint uVar3;
  section *psVar4;
  section_impl<ELFIO::Elf64_Shdr> *local_20;
  
  peVar1 = (this->header)._M_t.
           super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
           super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (peVar1 == (elf_header *)0x0) {
LAB_00104410:
    std::
    vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
    ::pop_back(&this->sections_);
    psVar4 = (section *)0x0;
  }
  else {
    uVar3 = (*peVar1->_vptr_elf_header[4])();
    if ((char)uVar3 == '\x01') {
      local_20 = (section_impl<ELFIO::Elf64_Shdr> *)operator_new(0xa8,(nothrow_t *)&std::nothrow);
      if (local_20 != (section_impl<ELFIO::Elf64_Shdr> *)0x0) {
        section_impl<ELFIO::Elf32_Shdr>::section_impl
                  ((section_impl<ELFIO::Elf32_Shdr> *)local_20,&this->convertor,
                   &this->addr_translator,&this->compression);
      }
      std::
      vector<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>,std::allocator<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>>>
      ::emplace_back<ELFIO::section_impl<ELFIO::Elf32_Shdr>*>
                ((vector<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>,std::allocator<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>>>
                  *)&this->sections_,(section_impl<ELFIO::Elf32_Shdr> **)&local_20);
    }
    else {
      if ((uVar3 & 0xff) != 2) goto LAB_00104410;
      local_20 = (section_impl<ELFIO::Elf64_Shdr> *)operator_new(0xc0,(nothrow_t *)&std::nothrow);
      if (local_20 != (section_impl<ELFIO::Elf64_Shdr> *)0x0) {
        section_impl<ELFIO::Elf64_Shdr>::section_impl
                  (local_20,&this->convertor,&this->addr_translator,&this->compression);
      }
      std::
      vector<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>,std::allocator<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>>>
      ::emplace_back<ELFIO::section_impl<ELFIO::Elf64_Shdr>*>
                ((vector<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>,std::allocator<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>>>
                  *)&this->sections_,&local_20);
    }
    puVar2 = (this->sections_).
             super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar4 = puVar2[-1]._M_t.
             super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
             super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl;
    local_20 = (section_impl<ELFIO::Elf64_Shdr> *)
               CONCAT62(local_20._2_6_,
                        (short)((uint)((int)puVar2 -
                                      *(int *)&(this->sections_).
                                               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1
                       );
    (*psVar4->_vptr_section[0x23])(psVar4);
  }
  return psVar4;
}

Assistant:

section* create_section()
    {
        if ( auto file_class = get_class(); file_class == ELFCLASS64 ) {
            sections_.emplace_back(
                new ( std::nothrow ) section_impl<Elf64_Shdr>(
                    &convertor, &addr_translator, compression ) );
        }
        else if ( file_class == ELFCLASS32 ) {
            sections_.emplace_back(
                new ( std::nothrow ) section_impl<Elf32_Shdr>(
                    &convertor, &addr_translator, compression ) );
        }
        else {
            sections_.pop_back();
            return nullptr;
        }

        section* new_section = sections_.back().get();
        new_section->set_index( static_cast<Elf_Half>( sections_.size() - 1 ) );

        return new_section;
    }